

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_constrain_curvature(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL *metric;
  undefined8 uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  REF_DBL *m1;
  long lVar7;
  REF_DBL m_constrained [6];
  REF_DBL m [6];
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x50f,
           "ref_metric_constrain_curvature","malloc curvature_metric of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    metric = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x50f,"ref_metric_constrain_curvature","malloc curvature_metric of REF_DBL NULL");
      RVar3 = 2;
    }
    else {
      uVar1 = ref_metric_from_curvature(metric,ref_grid);
      if (uVar1 == 0) {
        iVar5 = 0x15;
        do {
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) {
            lVar7 = 0;
            m1 = metric;
            goto LAB_001c6c28;
          }
          uVar1 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
        } while (uVar1 == 0);
        uVar4 = (ulong)uVar1;
        pcVar6 = "grad";
        uVar2 = 0x514;
      }
      else {
        uVar4 = (ulong)uVar1;
        pcVar6 = "curve";
        uVar2 = 0x510;
      }
LAB_001c6c01:
      RVar3 = (REF_STATUS)uVar4;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar2,"ref_metric_constrain_curvature",uVar4,pcVar6);
    }
  }
  return RVar3;
LAB_001c6c28:
  if (ref_node->max <= lVar7) {
    free(metric);
    return 0;
  }
  if (-1 < ref_node->global[lVar7]) {
    uVar1 = ref_node_metric_get(ref_node,(REF_INT)lVar7,m);
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      pcVar6 = "get";
      uVar2 = 0x518;
      goto LAB_001c6c01;
    }
    uVar1 = ref_matrix_intersect(m1,m,m_constrained);
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      pcVar6 = "intersect";
      uVar2 = 0x51a;
      goto LAB_001c6c01;
    }
    if ((ref_grid->twod != 0) && (uVar1 = ref_matrix_twod_m(m_constrained), uVar1 != 0)) {
      uVar4 = (ulong)uVar1;
      pcVar6 = "enforce twod";
      uVar2 = 0x51c;
      goto LAB_001c6c01;
    }
    uVar1 = ref_node_metric_set(ref_node,(REF_INT)lVar7,m_constrained);
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      pcVar6 = "set node met";
      uVar2 = 0x51d;
      goto LAB_001c6c01;
    }
  }
  lVar7 = lVar7 + 1;
  m1 = m1 + 6;
  goto LAB_001c6c28;
}

Assistant:

REF_FCN REF_STATUS ref_metric_constrain_curvature(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *curvature_metric;
  REF_DBL m[6], m_constrained[6];
  REF_INT node, gradation;

  ref_malloc(curvature_metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_curvature(curvature_metric, ref_grid), "curve");
  for (gradation = 0; gradation < 20; gradation++) {
    RSS(ref_metric_mixed_space_gradation(curvature_metric, ref_grid, -1.0,
                                         -1.0),
        "grad");
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_matrix_intersect(&(curvature_metric[6 * node]), m, m_constrained),
        "intersect");
    if (ref_grid_twod(ref_grid))
      RSS(ref_matrix_twod_m(m_constrained), "enforce twod");
    RSS(ref_node_metric_set(ref_node, node, m_constrained), "set node met");
  }

  ref_free(curvature_metric);

  return REF_SUCCESS;
}